

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinifyImportsAndExports.cpp
# Opt level: O1

void __thiscall
wasm::MinifyImportsAndExports::MinifyImportsAndExports
          (MinifyImportsAndExports *this,bool minifyExports,bool minifyModules)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string_view sVar2;
  
  (this->super_Pass).runner = (PassRunner *)0x0;
  paVar1 = &(this->super_Pass).name.field_2;
  (this->super_Pass).name._M_dataplus._M_p = (pointer)paVar1;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass).name.field_2._M_local_buf[0] = '\0';
  (this->super_Pass).passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Pass_01093be8;
  this->minifyExports = minifyExports;
  this->minifyModules = minifyModules;
  sVar2 = IString::interned((IString *)0x1,(string_view)ZEXT816(0xe72de9),SUB81(paVar1,0));
  (this->SINGLETON_MODULE_NAME).super_IString.str = sVar2;
  return;
}

Assistant:

explicit MinifyImportsAndExports(bool minifyExports, bool minifyModules)
    : minifyExports(minifyExports), minifyModules(minifyModules) {}